

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

void decompressBlockETC21BitAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alphaimg,int width,int height,
               int startx,int starty,int channelsRGB)

{
  bool bVar1;
  sbyte sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint8 *alpha;
  int iVar7;
  uint uVar8;
  uint height_00;
  int iVar9;
  int iVar10;
  int y;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  alpha = img + 3;
  if (channelsRGB == 3) {
    alpha = alphaimg;
  }
  height_00 = block_part1 >> 0xb & 0x1f;
  uVar5 = block_part1 << 5;
  uVar8 = ((int)uVar5 >> 0x1d) + (block_part1 >> 0x1b);
  uVar3 = ((int)(block_part1 << 0x15) >> 0x1d) + height_00;
  if ((block_part1 & 2) == 0) {
    if (uVar8 < 0x20) {
      uVar8 = ((int)(block_part1 << 0xd) >> 0x1d) + (block_part1 >> 0x13 & 0x1f);
      if (uVar8 < 0x20) {
        if (uVar3 < 0x20) {
          decompressBlockDifferentialWithAlphaC
                    (block_part1,block_part2,img,alpha,width,uVar8,startx,starty,channelsRGB);
          return;
        }
        decompressBlockPlanar57c
                  ((block_part1 & 0x3fc) << 6 |
                   uVar5 & 0x30000 | (block_part1 & 0x7f0000) * 4 + (block_part1 & 0xff000000) * 2 |
                   (block_part1 & 1) << 7 | block_part2 >> 0x19,block_part2 << 7,img,width,
                   block_part2 >> 0x19,startx,starty,channelsRGB);
        sVar2 = (channelsRGB != 3) * '\x02';
        iVar12 = starty + 3;
        iVar6 = iVar12;
        if (iVar12 < starty) {
          iVar6 = starty;
        }
        uVar3 = iVar6 - starty;
        iVar4 = starty * width + startx;
        iVar6 = width * 4;
        iVar13 = iVar12 * width + startx;
        iVar9 = (starty + 2) * width + startx;
        iVar11 = (starty + 1) * width + startx;
        iVar12 = startx;
        do {
          uVar5 = 0;
          iVar14 = iVar13;
          iVar7 = iVar4;
          iVar10 = iVar11;
          iVar15 = iVar9;
          do {
            if ((bool)(~((int)(uVar3 ^ 0x80000000) < (int)(uVar5 ^ 0x80000000)) & 1)) {
              alpha[iVar7 << sVar2] = 0xff;
            }
            bVar1 = (int)((uVar5 | 1) ^ 0x80000000) <= (int)(uVar3 ^ 0x80000000);
            if (bVar1) {
              alpha[iVar10 << sVar2] = 0xff;
            }
            if ((int)(uVar5 ^ 0x80000000) <= (int)(uVar3 ^ 0x80000000)) {
              alpha[iVar15 << sVar2] = 0xff;
            }
            if (bVar1) {
              alpha[iVar14 << sVar2] = 0xff;
            }
            uVar5 = uVar5 + 4;
            iVar7 = iVar7 + iVar6;
            iVar14 = iVar14 + iVar6;
            iVar15 = iVar15 + iVar6;
            iVar10 = iVar10 + iVar6;
          } while ((uVar3 + 4 & 0xfffffffc) != uVar5);
          iVar4 = iVar4 + 1;
          iVar13 = iVar13 + 1;
          iVar9 = iVar9 + 1;
          iVar11 = iVar11 + 1;
          bVar1 = iVar12 < startx + 3;
          iVar12 = iVar12 + 1;
        } while (bVar1);
      }
      else {
        decompressBlockTHUMB58HAlphaC
                  (block_part1 >> 1 & 0x1fffe |
                   block_part1 >> 2 & 0x60000 | block_part1 & 1 | block_part1 >> 5 & 0x3f80000,
                   block_part2,img,alpha,width,uVar8,startx,starty,channelsRGB);
      }
    }
    else {
      decompressBlockTHUMB59TAlphaC
                (block_part1 >> 2 & 0x6000000 | block_part1 & 1 | block_part1 >> 1 & 0x1fffffe,
                 block_part2,img,alpha,width,height_00,startx,starty,channelsRGB);
    }
  }
  else {
    if (uVar8 < 0x20) {
      uVar8 = ((int)(block_part1 << 0xd) >> 0x1d) + (block_part1 >> 0x13 & 0x1f);
      if (uVar8 < 0x20) {
        if (uVar3 < 0x20) {
          decompressBlockDifferentialWithAlphaC
                    (block_part1,block_part2,img,alpha,width,uVar8,startx,starty,channelsRGB);
        }
        else {
          decompressBlockPlanar57c
                    ((block_part1 & 0x3fc) << 6 |
                     uVar5 & 0x30000 | (block_part1 & 0x7f0000) * 4 + (block_part1 & 0xff000000) * 2
                     | (block_part1 & 1) << 7 | block_part2 >> 0x19,block_part2 << 7,img,width,
                     block_part2 >> 0x19,startx,starty,channelsRGB);
        }
      }
      else {
        uVar3 = block_part1 >> 2 & 0x60000 | block_part1 & 1 | block_part1 >> 5 & 0x3f80000;
        decompressBlockTHUMB58Hc
                  (block_part1 >> 1 & 0x1fffe | uVar3,block_part2,img,width,uVar3,startx,starty,
                   channelsRGB);
      }
    }
    else {
      decompressBlockTHUMB59Tc
                (block_part1 >> 2 & 0x6000000 | block_part1 & 1 | block_part1 >> 1 & 0x1fffffe,
                 block_part2,img,width,uVar8,startx,starty,channelsRGB);
    }
    sVar2 = (channelsRGB != 3) * '\x02';
    iVar12 = starty + 3;
    iVar6 = iVar12;
    if (iVar12 < starty) {
      iVar6 = starty;
    }
    uVar3 = iVar6 - starty;
    iVar9 = starty * width + startx;
    iVar6 = width * 4;
    iVar4 = iVar12 * width + startx;
    iVar11 = (starty + 2) * width + startx;
    iVar13 = (starty + 1) * width + startx;
    iVar12 = startx;
    do {
      uVar5 = 0;
      iVar7 = iVar11;
      iVar10 = iVar13;
      iVar15 = iVar9;
      iVar14 = iVar4;
      do {
        if ((bool)(~((int)(uVar3 ^ 0x80000000) < (int)(uVar5 ^ 0x80000000)) & 1)) {
          alpha[iVar15 << sVar2] = 0xff;
        }
        bVar1 = (int)((uVar5 | 1) ^ 0x80000000) <= (int)(uVar3 ^ 0x80000000);
        if (bVar1) {
          alpha[iVar10 << sVar2] = 0xff;
        }
        if ((int)(uVar5 ^ 0x80000000) <= (int)(uVar3 ^ 0x80000000)) {
          alpha[iVar7 << sVar2] = 0xff;
        }
        if (bVar1) {
          alpha[iVar14 << sVar2] = 0xff;
        }
        uVar5 = uVar5 + 4;
        iVar15 = iVar15 + iVar6;
        iVar14 = iVar14 + iVar6;
        iVar7 = iVar7 + iVar6;
        iVar10 = iVar10 + iVar6;
      } while ((uVar3 + 4 & 0xfffffffc) != uVar5);
      iVar9 = iVar9 + 1;
      iVar4 = iVar4 + 1;
      iVar11 = iVar11 + 1;
      iVar13 = iVar13 + 1;
      bVar1 = iVar12 < startx + 3;
      iVar12 = iVar12 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void decompressBlockETC21BitAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alphaimg, int width, int height, int startx, int starty, int channelsRGB)
{
	int diffbit;
	signed char color1[3];
	signed char diff[3];
	signed char red, green, blue;
  int channelsA;	

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alphaimg = &img[0+3];
  }

	diffbit = (GETBITSHIGH(block_part1, 1, 33));

	if( diffbit )
	{
		// We have diffbit = 1, meaning no transparent pixels. regular decompression.

		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];

		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59Tc(block59_part1, block59_part2, img, width, height, startx, starty, channelsRGB);
		}
		else if (green < 0 || green > 31)
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58Hc(block58_part1, block58_part2, img, width, height, startx, starty, channelsRGB);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channelsRGB);
		}
		else
		{
 			decompressBlockDifferentialWithAlphaC(block_part1, block_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		for(int x=startx; x<startx+4; x++) 
		{
			for(int y=starty; y<starty+4; y++) 
			{
				alphaimg[channelsA*(x+y*width)]=255;
			}
		}
	}
	else
	{
		// We have diffbit = 0, transparent pixels. Only T-, H- or regular diff-mode possible.
		
		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];
		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59TAlphaC(block59_part1, block59_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		else if(green < 0 || green > 31) 
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58HAlphaC(block58_part1, block58_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channelsRGB);
			for(int x=startx; x<startx+4; x++) 
			{
				for(int y=starty; y<starty+4; y++) 
				{
					alphaimg[channelsA*(x+y*width)]=255;
				}
			}
		}
		else
			decompressBlockDifferentialWithAlphaC(block_part1, block_part2, img,alphaimg, width, height, startx, starty, channelsRGB);
	}
}